

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

bool __thiscall
cmCTestCurl::UploadFile
          (cmCTestCurl *this,string *param_1,string *url,string *fields,string *response)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  Curl_easy *data;
  bool bVar3;
  char *pcVar4;
  FILE *__stream;
  ostream *poVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  reference pbVar8;
  ulong uVar9;
  string local_af8 [32];
  undefined1 local_ad8 [8];
  ostringstream cmCTestLog_msg_5;
  string local_960 [32];
  undefined1 local_940 [8];
  ostringstream cmCTestLog_msg_4;
  allocator<char> local_7c1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_7c0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_7b8;
  string local_7b0 [32];
  string local_790 [8];
  string curlDebug;
  undefined1 local_750 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_5d1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5d0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5c8;
  string local_5c0 [32];
  undefined1 local_5a0 [8];
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  undefined1 local_550 [8];
  ostringstream cmCTestLog_msg_2;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  unsigned_long filelen;
  undefined1 local_3a0 [8];
  string upload_url;
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  FILE *ftpfile;
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  string *response_local;
  string *fields_local;
  string *url_local;
  string *local_file_local;
  cmCTestCurl *this_local;
  
  std::__cxx11::string::clear();
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_UPLOAD,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_VERBOSE,1);
    __stream = (FILE *)cmsys::SystemTools::Fopen(param_1,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar5 = std::operator<<((ostream *)local_360,"Could not open file for upload: ");
      poVar5 = std::operator<<(poVar5,(string *)param_1);
      std::operator<<(poVar5,"\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0x89,pcVar4,false);
      std::__cxx11::string::~string((string *)(upload_url.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_360);
      this_local._7_1_ = false;
    }
    else {
      filelen._7_1_ = 0x3f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                ((string *)local_3a0,url,(char *)((long)&filelen + 7),fields);
      data = (Curl_easy *)this->Curl;
      uVar6 = std::__cxx11::string::c_str();
      curl_easy_setopt(data,CURLOPT_URL,uVar6);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_READDATA,__stream);
      uVar7 = cmsys::SystemTools::FileLength(param_1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_INFILESIZE,uVar7);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                       anon_unknown.dwarf_3c59a2::curlWriteMemoryCallback);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                       anon_unknown.dwarf_3c59a2::curlDebugCallback);
      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->HttpHeaders);
      h = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->HttpHeaders);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&h), bVar3) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
        poVar5 = std::operator<<((ostream *)local_550,"   Add HTTP Header: \"");
        poVar5 = std::operator<<(poVar5,(string *)pbVar8);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0x9f,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
        ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_550);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)curl_slist_append((curl_slist *)__range1,pcVar4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,__range1);
      puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)puVar1);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_5a0);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA,puVar1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,local_5a0);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
      curl_easy_perform((Curl_easy *)this->Curl);
      fclose(__stream);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,0);
      curl_slist_free_all((curl_slist *)__range1);
      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)
                         &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
      if (!bVar3) {
        puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
        local_5c8._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)puVar1);
        local_5d0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)puVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  (local_5c0,local_5c8,local_5d0,&local_5d1);
        std::__cxx11::string::operator=((string *)response,local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator(&local_5d1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_750);
        poVar5 = std::operator<<((ostream *)local_750,"Curl response: [");
        poVar5 = std::operator<<(poVar5,(string *)response);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb1,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)(curlDebug.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_750);
      }
      std::__cxx11::string::string(local_790);
      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)local_5a0);
      if (!bVar3) {
        local_7b8._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)local_5a0);
        local_7c0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)local_5a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  (local_7b0,local_7b8,local_7c0,&local_7c1);
        std::__cxx11::string::operator=(local_790,local_7b0);
        std::__cxx11::string::~string(local_7b0);
        std::allocator<char>::~allocator(&local_7c1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_940);
        poVar5 = std::operator<<((ostream *)local_940,"Curl debug: [");
        poVar5 = std::operator<<(poVar5,local_790);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb7,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_960);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_940);
      }
      uVar9 = std::__cxx11::string::empty();
      bVar3 = (uVar9 & 1) != 0;
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ad8);
        poVar5 = std::operator<<((ostream *)local_ad8,"No response from server.\n");
        poVar5 = std::operator<<(poVar5,local_790);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xbc,pcVar4,false);
        std::__cxx11::string::~string(local_af8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ad8);
      }
      this_local._7_1_ = !bVar3;
      std::__cxx11::string::~string(local_790);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_5a0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::string::~string((string *)local_3a0);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,"Initialization of curl failed\n");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x7e,pcVar4,false);
    std::__cxx11::string::~string((string *)&ftpfile);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCurl::UploadFile(std::string const& local_file,
                             std::string const& url, std::string const& fields,
                             std::string& response)
{
  response.clear();
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed\n");
    return false;
  }
  /* enable uploading */
  curl_easy_setopt(this->Curl, CURLOPT_UPLOAD, 1);

  ::curl_easy_setopt(this->Curl, CURLOPT_VERBOSE, 1);

  FILE* ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
  if (!ftpfile) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not open file for upload: " << local_file << "\n");
    return false;
  }
  // set the url
  std::string upload_url = cmStrCat(url, '?', fields);
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, upload_url.c_str());
  // now specify which file to upload
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILE, ftpfile);
  unsigned long filelen = cmSystemTools::FileLength(local_file);
  // and give the size of the upload (optional)
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILESIZE,
                     static_cast<long>(filelen));
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");
  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);
  // Now run off and do what you've been told!
  ::curl_easy_perform(this->Curl);
  ::fclose(ftpfile);
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, nullptr);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  std::string curlDebug;
  if (!debugData.empty()) {
    curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  if (response.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "No response from server.\n"
                 << curlDebug << std::endl);
    return false;
  }
  return true;
}